

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int gen_publickey_from_sk_ed25519_openssh_priv_data
              (LIBSSH2_SESSION *session,string_buf *decrypted,uchar **method,size_t *method_len,
              uchar **pubkeydata,size_t *pubkeydata_len,uchar *flags,char **application,
              uchar **key_handle,size_t *handle_len,EVP_PKEY **out_ctx)

{
  int iVar1;
  uchar *puVar2;
  char *pcVar3;
  size_t app_len;
  uchar *p;
  EVP_PKEY *local_60;
  uchar *app;
  uchar *pub_key;
  uchar *local_48;
  size_t local_40;
  size_t tmp_len;
  
  app_len = 0;
  tmp_len = 0;
  iVar1 = _libssh2_get_string(decrypted,&pub_key,&tmp_len);
  if ((iVar1 == 0) && (tmp_len == 0x20)) {
    iVar1 = _libssh2_get_string(decrypted,&app,&app_len);
    if (iVar1 == 0) {
      if ((flags == (uchar *)0x0) || (iVar1 = _libssh2_get_byte(decrypted,flags), iVar1 == 0)) {
        if (handle_len != (size_t *)0x0 && key_handle != (uchar **)0x0) {
          p = (uchar *)0x0;
          iVar1 = _libssh2_get_string(decrypted,&p,handle_len);
          if (iVar1 != 0) {
            pcVar3 = "No SK key_handle.";
            goto LAB_0010de49;
          }
          if (*handle_len != 0) {
            puVar2 = (uchar *)(*session->alloc)(*handle_len,&session->abstract);
            *key_handle = puVar2;
            memcpy(puVar2,p,*handle_len);
          }
        }
        local_60 = (EVP_PKEY *)EVP_PKEY_new_raw_public_key(0x43f,0,pub_key,0x20);
        puVar2 = (uchar *)(*session->alloc)(0x1a,&session->abstract);
        if (puVar2 != (uchar *)0x0) {
          local_40 = app_len + 0x46;
          local_48 = (uchar *)_libssh2_calloc(session,local_40);
          if (local_48 != (uchar *)0x0) {
            p = local_48;
            _libssh2_store_str(&p,"sk-ssh-ed25519@openssh.com",0x1a);
            _libssh2_store_str(&p,(char *)pub_key,0x20);
            _libssh2_store_str(&p,(char *)app,app_len);
            if (app_len != 0 && application != (char **)0x0) {
              pcVar3 = (char *)(*session->alloc)(app_len + 1,&session->abstract);
              *application = pcVar3;
              explicit_bzero(pcVar3,app_len + 1);
              memcpy(*application,app,app_len);
            }
            builtin_memcpy(puVar2,"sk-ssh-ed25519@openssh.com",0x1a);
            if (method == (uchar **)0x0) {
              (*session->free)(puVar2,&session->abstract);
            }
            else {
              *method = puVar2;
            }
            if (method_len != (size_t *)0x0) {
              *method_len = 0x1a;
            }
            if (pubkeydata == (uchar **)0x0) {
              (*session->free)(local_48,&session->abstract);
            }
            else {
              *pubkeydata = local_48;
            }
            if (pubkeydata_len != (size_t *)0x0) {
              *pubkeydata_len = local_40;
            }
            if (out_ctx != (EVP_PKEY **)0x0) {
              *out_ctx = (EVP_PKEY *)local_60;
              return 0;
            }
            if (local_60 == (EVP_PKEY *)0x0) {
              return 0;
            }
            EVP_PKEY_free(local_60);
            return 0;
          }
        }
        _libssh2_error(session,-6,"Unable to allocate memory for ED25519 key");
        if (local_60 != (EVP_PKEY *)0x0) {
          EVP_PKEY_free(local_60);
        }
        if (puVar2 != (uchar *)0x0) {
          (*session->free)(puVar2,&session->abstract);
        }
        if ((application != (char **)0x0) && (*application != (char *)0x0)) {
          (*session->free)(application,&session->abstract);
          *application = (char *)0x0;
        }
        if (key_handle == (uchar **)0x0) {
          return -1;
        }
        if (*key_handle == (uchar *)0x0) {
          return -1;
        }
        (*session->free)(key_handle,&session->abstract);
        *key_handle = (uchar *)0x0;
        return -1;
      }
      pcVar3 = "No SK flags.";
    }
    else {
      pcVar3 = "No SK application.";
    }
  }
  else {
    pcVar3 = "Wrong public key length";
  }
LAB_0010de49:
  _libssh2_error(session,-0xe,pcVar3);
  return -1;
}

Assistant:

static int
gen_publickey_from_sk_ed25519_openssh_priv_data(LIBSSH2_SESSION *session,
                                                struct string_buf *decrypted,
                                                unsigned char **method,
                                                size_t *method_len,
                                                unsigned char **pubkeydata,
                                                size_t *pubkeydata_len,
                                                unsigned char *flags,
                                                const char **application,
                                              const unsigned char **key_handle,
                                                size_t *handle_len,
                                                libssh2_ed25519_ctx **out_ctx)
{
    const char *key_type = "sk-ssh-ed25519@openssh.com";

    libssh2_ed25519_ctx *ctx = NULL;
    unsigned char *method_buf = NULL;
    unsigned char *key = NULL;
    int ret = 0;
    unsigned char *pub_key, *app;
    size_t key_len = 0, app_len = 0, tmp_len = 0;
    unsigned char *p;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing sk-ED25519 keys from private key data"));

    if(_libssh2_get_string(decrypted, &pub_key, &tmp_len) ||
       tmp_len != LIBSSH2_ED25519_KEY_LEN) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "Wrong public key length");
        return -1;
    }

    if(_libssh2_get_string(decrypted, &app, &app_len)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "No SK application.");
        return -1;
    }

    if(flags && _libssh2_get_byte(decrypted, flags)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "No SK flags.");
        return -1;
    }

    if(key_handle && handle_len) {
        unsigned char *handle = NULL;
        if(_libssh2_get_string(decrypted, &handle, handle_len)) {
            _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                           "No SK key_handle.");
            return -1;
        }

        if(*handle_len > 0) {
            *key_handle = LIBSSH2_ALLOC(session, *handle_len);

            if(key_handle) {
                memcpy((void *)*key_handle, handle, *handle_len);
            }
        }
    }

    ctx = EVP_PKEY_new_raw_public_key(EVP_PKEY_ED25519, NULL,
                                      (const unsigned char *)pub_key,
                                      LIBSSH2_ED25519_KEY_LEN);

    if(ret == 0) {
        _libssh2_debug((session,
                       LIBSSH2_TRACE_AUTH,
                       "Computing public key from ED25519 "
                       "private key envelope"));

        /* sk-ssh-ed25519@openssh.com. */
        method_buf = LIBSSH2_ALLOC(session, strlen(key_type));
        if(!method_buf) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for ED25519 key");
            goto clean_exit;
        }

        /* Key form is: type_len(4) + type(26) + pub_key_len(4) +
           pub_key(32) + application_len(4) + application(X). */
        key_len = LIBSSH2_ED25519_KEY_LEN + 38 + app_len;
        key = LIBSSH2_CALLOC(session, key_len);
        if(!key) {
            _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for ED25519 key");
            goto clean_exit;
        }

        p = key;

        _libssh2_store_str(&p, key_type, strlen(key_type));
        _libssh2_store_str(&p, (const char *)pub_key, LIBSSH2_ED25519_KEY_LEN);
        _libssh2_store_str(&p, (const char *)app, app_len);

        if(application && app_len > 0) {
            *application = (const char *)LIBSSH2_ALLOC(session, app_len + 1);
            _libssh2_explicit_zero((void *)*application, app_len + 1);
            memcpy((void *)*application, app, app_len);
        }

        memcpy(method_buf, key_type, strlen(key_type));

        if(method)
            *method = method_buf;
        else
            LIBSSH2_FREE(session, method_buf);

        if(method_len)
            *method_len = strlen(key_type);

        if(pubkeydata)
            *pubkeydata = key;
        else if(key)
            LIBSSH2_FREE(session, key);

        if(pubkeydata_len)
            *pubkeydata_len = key_len;

        if(out_ctx)
            *out_ctx = ctx;
        else if(ctx)
            _libssh2_ed25519_free(ctx);

        return 0;
    }

clean_exit:

    if(ctx)
        _libssh2_ed25519_free(ctx);

    if(method_buf)
        LIBSSH2_FREE(session, method_buf);

    if(key)
        LIBSSH2_FREE(session, key);

    if(application && *application) {
        LIBSSH2_FREE(session, (void *)application);
        *application = NULL;
    }

    if(key_handle && *key_handle) {
        LIBSSH2_FREE(session, (void *)key_handle);
        *key_handle = NULL;
    }

    return -1;
}